

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeWorkItem.cpp
# Opt level: O2

JITTimePolymorphicInlineCacheInfo * __thiscall
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(JITTimeWorkItem *this,intptr_t funcBodyAddr)

{
  PolymorphicInlineCacheInfoIDL *pPVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = -0x20;
  do {
    lVar3 = lVar2;
    if ((ulong)this->m_workItemData->inlineeInfoCount << 5 == lVar3 + 0x20) {
      return (JITTimePolymorphicInlineCacheInfo *)0x0;
    }
    pPVar1 = this->m_workItemData->inlineeInfo;
    lVar2 = lVar3 + 0x20;
  } while (*(long *)((long)&pPVar1[1].functionBodyAddr.ptr + lVar3) != funcBodyAddr);
  return (JITTimePolymorphicInlineCacheInfo *)((long)&pPVar1[1].polymorphicInlineCacheCount + lVar3)
  ;
}

Assistant:

JITTimePolymorphicInlineCacheInfo *
JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(intptr_t funcBodyAddr)
{
    for (uint i = 0; i < m_workItemData->inlineeInfoCount; ++i)
    {
        if (m_workItemData->inlineeInfo[i].functionBodyAddr == (void*)funcBodyAddr)
        {
            return (JITTimePolymorphicInlineCacheInfo *)&m_workItemData->inlineeInfo[i];
        }
    }
    return nullptr;
}